

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample_n_1<2>
          (ssg_resampler<ymfm::ymfm_output<4>,_1,_false> *this,ymfm_output<4> *output,
          uint32_t numsamples)

{
  int32_t iVar1;
  uint uVar2;
  int32_t *piVar3;
  
  if (numsamples != 0) {
    uVar2 = this->m_sampindex;
    piVar3 = output->data + 3;
    do {
      if ((uVar2 & 1) == 0) {
        ssg_engine::clock(this->m_ssg);
        ssg_engine::output(this->m_ssg,&this->m_last);
      }
      iVar1 = (this->m_last).data[2];
      *(undefined8 *)(piVar3 + -2) = *(undefined8 *)(this->m_last).data;
      *piVar3 = iVar1;
      uVar2 = this->m_sampindex + 1;
      this->m_sampindex = uVar2;
      piVar3 = piVar3 + 4;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_n_1(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		if (m_sampindex % Multiplier == 0)
		{
			m_ssg.clock();
			m_ssg.output(m_last);
		}
		write_to_output(output, m_last.data[0], m_last.data[1], m_last.data[2]);
	}
}